

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdUVTexture *tex,uint32_t indent,
          bool closing_brace)

{
  ostream *poVar1;
  uint32_t indent_00;
  string *psVar2;
  uint32_t n;
  uint32_t n_00;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  UsdUVTexture *tex_local;
  
  local_1c = (uint)tex;
  local_1d = (byte)indent & 1;
  psVar2 = __return_storage_ptr__;
  ptStack_18 = this;
  tex_local = (UsdUVTexture *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar2;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar1 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  ::std::operator<<(poVar1,"{\n");
  ::std::__cxx11::string::~string((string *)&local_1c8);
  print_shader_params_abi_cxx11_(&local_1e8,ptStack_18,(UsdUVTexture *)(ulong)local_1c,indent_00);
  ::std::operator<<(aoStack_198,(string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar1 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar1,"}\n");
    ::std::__cxx11::string::~string((string *)&local_208);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const UsdUVTexture &tex, const uint32_t indent,
                      bool closing_brace) {
  // TODO: Print spec and meta?
  std::stringstream ss;

  ss << pprint::Indent(indent) << "{\n";
  ss << print_shader_params(tex, indent);
  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}